

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O0

void readoptions(int argc,char **argv)

{
  char *pcVar1;
  Addr AVar2;
  bool bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  istream *piVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *this;
  int iVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  allocator local_78b;
  undefined1 local_78a;
  allocator local_789;
  string local_788 [38];
  undefined1 local_762;
  allocator local_761;
  string local_760 [32];
  pair<unsigned_long,_unsigned_long> local_740;
  string local_730 [32];
  string local_710 [8];
  string line;
  ifstream local_6f0 [520];
  pair<unsigned_long,_unsigned_long> local_4e8;
  allocator local_4d1;
  string local_4d0 [32];
  pair<unsigned_long,_unsigned_long> local_4b0;
  stringstream local_4a0 [8];
  stringstream ss;
  ostream local_490 [383];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [35];
  undefined1 local_275;
  allocator local_261;
  string local_260 [32];
  istream local_240 [8];
  ifstream input;
  unsigned_long local_38;
  Addr end;
  Addr start;
  char *idx;
  char **ppcStack_18;
  int opt;
  char **argv_local;
  int argc_local;
  
  ppcStack_18 = argv;
  argv_local._4_4_ = argc;
  std::ifstream::ifstream(local_240);
  do {
    idx._4_4_ = getopt(argv_local._4_4_,ppcStack_18,"t:s:r:a:A:i:d:");
    if (idx._4_4_ == -1) {
      if (argv_local._4_4_ <= _optind) {
        usage(*ppcStack_18);
      }
      iVar9 = _optind + 1;
      config.input = ppcStack_18[_optind];
      _optind = iVar9;
      if (iVar9 < argv_local._4_4_) {
        local_78a = 1;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_788,"Unknown extra option: ",&local_789);
        std::operator+(pbVar8,(char *)local_788);
        local_78a = 0;
        __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      if (config.type == SHOW_ALL) {
        this = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(this,"-t option is mandatory",&local_78b);
        __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::ifstream::~ifstream(local_240);
      return;
    }
    switch(idx._4_4_) {
    case 0x41:
      std::ifstream::ifstream(local_6f0,_optarg,_S_in);
      std::ifstream::operator=(local_240,local_6f0);
      std::ifstream::~ifstream(local_6f0);
      std::__cxx11::string::string(local_710);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_710)
        ;
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar3) break;
        trim((string *)local_710);
        uVar7 = std::__cxx11::string::length();
        if (1 < uVar7) {
          iVar9 = std::__cxx11::string::compare((ulong)local_710,0,(char *)0x2);
          if (iVar9 != 0) {
            std::__cxx11::string::substr((ulong)local_730,(ulong)local_710);
            std::__cxx11::string::operator=(local_710,local_730);
            std::__cxx11::string::~string(local_730);
          }
        }
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          end = std::__cxx11::stoul((string *)local_710,(size_t *)0x0,0x10);
          if (end != 0) {
            pVar10 = std::make_pair<unsigned_long&,unsigned_long&>(&end,&end);
            local_740 = pVar10;
            std::__cxx11::
            list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back(&config.ranges,&local_740);
          }
        }
      }
      std::__cxx11::string::~string(local_710);
      std::ifstream::close();
      break;
    default:
      local_762 = 1;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_760,"Invalid option: ",&local_761);
      std::operator+(pbVar8,(char)local_760);
      local_762 = 0;
      __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    case 0x61:
      iVar9 = strncasecmp(_optarg,"0x",2);
      if (iVar9 != 0) {
        _optarg = _optarg + 2;
      }
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,pcVar1,&local_4d1);
      end = std::__cxx11::stoul((string *)local_4d0,(size_t *)0x0,0x10);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      if (end != 0) {
        pVar10 = std::make_pair<unsigned_long&,unsigned_long&>(&end,&end);
        local_4e8 = pVar10;
        std::__cxx11::
        list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back(&config.ranges,&local_4e8);
      }
      break;
    case 100:
      config.dump = _optarg;
      break;
    case 0x69:
      config.instrs = _optarg;
      break;
    case 0x72:
      start = (Addr)strchr(_optarg,0x3a);
      if ((char *)start == (char *)0x0) {
        local_2c2 = 1;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2c0,"invalid range: ",&local_2c1);
        std::operator+(pbVar8,(char *)local_2c0);
        local_2c2 = 0;
        __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      *(char *)start = '\0';
      start = start + 1;
      iVar9 = strncasecmp(_optarg,"0x",2);
      if (iVar9 != 0) {
        _optarg = _optarg + 2;
      }
      iVar9 = strncasecmp((char *)start,"0x",2);
      pcVar1 = _optarg;
      if (iVar9 != 0) {
        start = start + 2;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,pcVar1,&local_2e9);
      end = std::__cxx11::stoul((string *)local_2e8,(size_t *)0x0,0x10);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      AVar2 = start;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,(char *)AVar2,&local_311);
      local_38 = std::__cxx11::stoul((string *)local_310,(size_t *)0x0,0x10);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      if (local_38 < end) {
        std::__cxx11::stringstream::stringstream(local_4a0);
        std::ostream::operator<<(local_490,std::hex);
        poVar4 = std::operator<<(local_490,"invalid range: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_38);
        poVar4 = std::operator<<(poVar4," < ");
        std::ostream::operator<<(poVar4,end);
        uVar5 = __cxa_allocate_exception(0x20);
        std::__cxx11::stringstream::str();
        __cxa_throw(uVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pVar10 = std::make_pair<unsigned_long&,unsigned_long&>(&end,&local_38);
      local_4b0 = pVar10;
      std::__cxx11::
      list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back(&config.ranges,&local_4b0);
      break;
    case 0x73:
      iVar9 = strcasecmp(_optarg,"all");
      if (iVar9 == 0) {
        config.show = SHOW_ALL;
      }
      else {
        iVar9 = strcasecmp(_optarg,"valid");
        if (iVar9 == 0) {
          config.show = BFTRACE_TYPE;
        }
        else {
          iVar9 = strcasecmp(_optarg,"invalid");
          if (iVar9 != 0) {
            local_29a = 1;
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_298,"invalid show: ",&local_299);
            std::operator+(pbVar8,(char *)local_298);
            local_29a = 0;
            __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          config.show = CFGGRIND_TYPE;
        }
      }
      break;
    case 0x74:
      iVar9 = strcasecmp(_optarg,"bftrace");
      if (iVar9 == 0) {
        config.type = BFTRACE_TYPE;
      }
      else {
        iVar9 = strcasecmp(_optarg,"cfggrind");
        if (iVar9 == 0) {
          config.type = CFGGRIND_TYPE;
        }
        else {
          iVar9 = strcasecmp(_optarg,"dcfg");
          if (iVar9 != 0) {
            local_275 = 1;
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_260,"invalid type: ",&local_261);
            std::operator+(pbVar8,(char *)local_260);
            local_275 = 0;
            __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          config.type = DCFG_TYPE;
        }
      }
    }
  } while( true );
}

Assistant:

void readoptions(int argc, char* argv[]) {
	int opt;
	char* idx;
	Addr start, end;
	std::ifstream input;

	while ((opt = getopt(argc, argv, "t:s:r:a:A:i:d:")) != -1) {
		switch (opt) {
			case 't':
				if (strcasecmp(optarg, "bftrace") == 0)
					config.type = Config::BFTRACE_TYPE;
				else if (strcasecmp(optarg, "cfggrind") == 0)
					config.type = Config::CFGGRIND_TYPE;
				else if (strcasecmp(optarg, "dcfg") == 0)
					config.type = Config::DCFG_TYPE;
				else
					throw std::string("invalid type: ") + optarg;

				break;
			case 's':
				if (strcasecmp(optarg, "all") == 0)
					config.show = Config::SHOW_ALL;
				else if (strcasecmp(optarg, "valid") == 0)
					config.show = Config::SHOW_VALID_ONLY;
				else if (strcasecmp(optarg, "invalid") == 0)
					config.show = Config::SHOW_INVALID_ONLY;
				else
					throw std::string("invalid show: ") + optarg;

				break;
			case 'r':
				idx = strchr(optarg, ':');
				if (!idx)
					throw std::string("invalid range: ") + optarg;

				*idx = 0;
				idx++;

				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;
				if (strncasecmp(idx, "0x", 2))
					idx += 2;

				start = std::stoul(optarg, 0, 16);
				end = std::stoul(idx, 0, 16);

				if (end < start) {
					std::stringstream ss;
					ss << std::hex;
					ss << "invalid range: " << end << " < " << start;

					throw ss.str();
				}

				config.ranges.push_back(std::make_pair(start, end));
				break;
			case 'a':
				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;

				start = std::stoul(optarg, 0, 16);
				if (start != 0)
					config.ranges.push_back(std::make_pair(start, start));
				break;
			case 'A':
				input = std::ifstream(optarg);
				for (std::string line; getline(input, line); ) {
					trim(line);

					if (line.length() >= 2 && line.compare(0, 2, "0x"))
						line = line.substr(2);

					if (line.empty())
						continue;

					start = std::stoul(line, 0, 16);
					if (start != 0)
						config.ranges.push_back(std::make_pair(start, start));
				}
				input.close();

				break;
			case 'i':
				config.instrs = optarg;
				break;
			case 'd':
				config.dump = optarg;
				break;
			default:
				throw std::string("Invalid option: ") + (char) optopt;
		}
	}

	if (optind >= argc)
		usage(argv[0]);

	config.input = argv[optind++];

	if (optind < argc)
		throw std::string("Unknown extra option: ") + argv[optind];

	if (config.type == Config::UNDEF_TYPE)
		throw std::string("-t option is mandatory");
}